

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O0

int PEM_def_callback(char *buf,int num,int w,void *key)

{
  size_t sVar1;
  size_t len;
  void *userdata_local;
  int rwflag_local;
  int size_local;
  char *buf_local;
  
  if (((buf == (char *)0x0) || (key == (void *)0x0)) || (num < 0)) {
    buf_local._4_4_ = -1;
  }
  else {
    sVar1 = strlen((char *)key);
    if (sVar1 < (ulong)(long)num) {
      OPENSSL_strlcpy(buf,(char *)key,(long)num);
      buf_local._4_4_ = (int)sVar1;
    }
    else {
      buf_local._4_4_ = -1;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int PEM_def_callback(char *buf, int size, int rwflag, void *userdata) {
  if (!buf || !userdata || size < 0) {
    return -1;
  }
  size_t len = strlen((char *)userdata);
  if (len >= (size_t)size) {
    return -1;
  }
  OPENSSL_strlcpy(buf, reinterpret_cast<char *>(userdata), (size_t)size);
  return (int)len;
}